

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1MB>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  bool bVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  byte bVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  InstancePrimitive *prim;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar43 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    auVar22 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar43 = ZEXT1664(auVar22);
  }
  pauVar18 = (undefined1 (*) [16])local_f68;
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_f98._4_4_ = uVar1;
  local_f98._0_4_ = uVar1;
  local_f98._8_4_ = uVar1;
  local_f98._12_4_ = uVar1;
  auVar41 = ZEXT1664(local_f98);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fa8._4_4_ = uVar1;
  local_fa8._0_4_ = uVar1;
  local_fa8._8_4_ = uVar1;
  local_fa8._12_4_ = uVar1;
  auVar42 = ZEXT1664(local_fa8);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fb8._4_4_ = uVar1;
  local_fb8._0_4_ = uVar1;
  local_fb8._8_4_ = uVar1;
  local_fb8._12_4_ = uVar1;
  auVar44 = ZEXT1664(local_fb8);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  bVar13 = false;
  do {
    local_fd8 = vsubps_avx(auVar41._0_16_,auVar22);
    fVar6 = auVar22._0_4_;
    fVar7 = auVar22._4_4_;
    fVar8 = auVar22._8_4_;
    fVar9 = auVar22._12_4_;
    local_fe8 = auVar41._0_4_ + fVar6;
    fStack_fe4 = auVar41._4_4_ + fVar7;
    fStack_fe0 = auVar41._8_4_ + fVar8;
    fStack_fdc = auVar41._12_4_ + fVar9;
    local_ff8 = vsubps_avx(auVar42._0_16_,auVar24);
    local_1008 = auVar42._0_4_ + auVar24._0_4_;
    fStack_1004 = auVar42._4_4_ + auVar24._4_4_;
    fStack_1000 = auVar42._8_4_ + auVar24._8_4_;
    fStack_ffc = auVar42._12_4_ + auVar24._12_4_;
    local_1018 = vsubps_avx(auVar44._0_16_,auVar28);
    local_1028._0_4_ = auVar44._0_4_ + auVar28._0_4_;
    local_1028._4_4_ = auVar44._4_4_ + auVar28._4_4_;
    local_1028._8_4_ = auVar44._8_4_ + auVar28._8_4_;
    local_1028._12_4_ = auVar44._12_4_ + auVar28._12_4_;
    local_f88._0_4_ = fVar6 * fVar6;
    local_f88._4_4_ = fVar7 * fVar7;
    local_f88._8_4_ = fVar8 * fVar8;
    local_f88._12_4_ = fVar9 * fVar9;
    auVar45 = ZEXT1664(local_f88);
    local_fc8 = auVar43._0_16_;
LAB_00b864ec:
    do {
      do {
        if (pauVar18 == (undefined1 (*) [16])&local_f78) {
          return bVar13;
        }
        pauVar12 = pauVar18 + -1;
        pauVar18 = pauVar18 + -1;
      } while (auVar43._0_4_ < *(float *)(*pauVar12 + 8));
      uVar19 = *(ulong *)*pauVar18;
LAB_00b8650a:
      uVar15 = (uint)uVar19;
      auVar22 = auVar41._0_16_;
      auVar24 = auVar42._0_16_;
      auVar28 = auVar44._0_16_;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar19 & 8) != 0) goto LAB_00b868f7;
        uVar14 = uVar19 & 0xfffffffffffffff0;
        fVar6 = query->time;
        auVar21._4_4_ = fVar6;
        auVar21._0_4_ = fVar6;
        auVar21._8_4_ = fVar6;
        auVar21._12_4_ = fVar6;
        auVar30._0_4_ = fVar6 * *(float *)(uVar14 + 0x80) + *(float *)(uVar14 + 0x20);
        auVar30._4_4_ = fVar6 * *(float *)(uVar14 + 0x84) + *(float *)(uVar14 + 0x24);
        auVar30._8_4_ = fVar6 * *(float *)(uVar14 + 0x88) + *(float *)(uVar14 + 0x28);
        auVar30._12_4_ = fVar6 * *(float *)(uVar14 + 0x8c) + *(float *)(uVar14 + 0x2c);
        auVar33._0_4_ = fVar6 * *(float *)(uVar14 + 0xa0) + *(float *)(uVar14 + 0x40);
        auVar33._4_4_ = fVar6 * *(float *)(uVar14 + 0xa4) + *(float *)(uVar14 + 0x44);
        auVar33._8_4_ = fVar6 * *(float *)(uVar14 + 0xa8) + *(float *)(uVar14 + 0x48);
        auVar33._12_4_ = fVar6 * *(float *)(uVar14 + 0xac) + *(float *)(uVar14 + 0x4c);
        auVar26._0_4_ = fVar6 * *(float *)(uVar14 + 0xc0) + *(float *)(uVar14 + 0x60);
        auVar26._4_4_ = fVar6 * *(float *)(uVar14 + 0xc4) + *(float *)(uVar14 + 100);
        auVar26._8_4_ = fVar6 * *(float *)(uVar14 + 200) + *(float *)(uVar14 + 0x68);
        auVar26._12_4_ = fVar6 * *(float *)(uVar14 + 0xcc) + *(float *)(uVar14 + 0x6c);
        auVar35._0_4_ = fVar6 * *(float *)(uVar14 + 0x90) + *(float *)(uVar14 + 0x30);
        auVar35._4_4_ = fVar6 * *(float *)(uVar14 + 0x94) + *(float *)(uVar14 + 0x34);
        auVar35._8_4_ = fVar6 * *(float *)(uVar14 + 0x98) + *(float *)(uVar14 + 0x38);
        auVar35._12_4_ = fVar6 * *(float *)(uVar14 + 0x9c) + *(float *)(uVar14 + 0x3c);
        auVar38._0_4_ = fVar6 * *(float *)(uVar14 + 0xb0) + *(float *)(uVar14 + 0x50);
        auVar38._4_4_ = fVar6 * *(float *)(uVar14 + 0xb4) + *(float *)(uVar14 + 0x54);
        auVar38._8_4_ = fVar6 * *(float *)(uVar14 + 0xb8) + *(float *)(uVar14 + 0x58);
        auVar38._12_4_ = fVar6 * *(float *)(uVar14 + 0xbc) + *(float *)(uVar14 + 0x5c);
        auVar40._0_4_ = fVar6 * *(float *)(uVar14 + 0xd0) + *(float *)(uVar14 + 0x70);
        auVar40._4_4_ = fVar6 * *(float *)(uVar14 + 0xd4) + *(float *)(uVar14 + 0x74);
        auVar40._8_4_ = fVar6 * *(float *)(uVar14 + 0xd8) + *(float *)(uVar14 + 0x78);
        auVar40._12_4_ = fVar6 * *(float *)(uVar14 + 0xdc) + *(float *)(uVar14 + 0x7c);
        auVar10 = vmaxps_avx(auVar22,auVar30);
        auVar10 = vminps_avx(auVar10,auVar35);
        auVar10 = vsubps_avx(auVar10,auVar22);
        auVar22 = vmaxps_avx(auVar24,auVar33);
        auVar22 = vminps_avx(auVar22,auVar38);
        auVar24 = vsubps_avx(auVar22,auVar24);
        auVar22 = vmaxps_avx(auVar28,auVar26);
        auVar22 = vminps_avx(auVar22,auVar40);
        auVar22 = vsubps_avx(auVar22,auVar28);
        local_1038._4_4_ =
             auVar22._4_4_ * auVar22._4_4_ +
             auVar24._4_4_ * auVar24._4_4_ + auVar10._4_4_ * auVar10._4_4_;
        local_1038._0_4_ =
             auVar22._0_4_ * auVar22._0_4_ +
             auVar24._0_4_ * auVar24._0_4_ + auVar10._0_4_ * auVar10._0_4_;
        fStack_1030 = auVar22._8_4_ * auVar22._8_4_ +
                      auVar24._8_4_ * auVar24._8_4_ + auVar10._8_4_ * auVar10._8_4_;
        fStack_102c = auVar22._12_4_ * auVar22._12_4_ +
                      auVar24._12_4_ * auVar24._12_4_ + auVar10._12_4_ * auVar10._12_4_;
        auVar22 = vcmpps_avx(auVar30,auVar35,2);
        auVar24 = vcmpps_avx(auVar38,local_ff8,5);
        auVar22 = vandps_avx(auVar22,auVar24);
        auVar11._4_4_ = fStack_fe4;
        auVar11._0_4_ = local_fe8;
        auVar11._8_4_ = fStack_fe0;
        auVar11._12_4_ = fStack_fdc;
        auVar24 = vcmpps_avx(auVar30,auVar11,2);
        auVar10._4_4_ = fStack_1004;
        auVar10._0_4_ = local_1008;
        auVar10._8_4_ = fStack_1000;
        auVar10._12_4_ = fStack_ffc;
        auVar28 = vcmpps_avx(auVar33,auVar10,2);
        auVar24 = vandps_avx(auVar28,auVar24);
        auVar28 = vcmpps_avx(auVar40,local_1018,5);
        auVar22 = vandps_avx(auVar22,auVar28);
        auVar28 = vcmpps_avx(auVar35,local_fd8,5);
        auVar10 = vcmpps_avx(auVar26,local_1028,2);
        auVar28 = vandps_avx(auVar10,auVar28);
        auVar24 = vandps_avx(auVar24,auVar28);
        auVar22 = vandps_avx(auVar24,auVar22);
        if ((uVar15 & 7) == 6) {
LAB_00b86720:
          auVar24 = vcmpps_avx(*(undefined1 (*) [16])((uVar19 & 0xfffffffffffffff0) + 0xe0),auVar21,
                               2);
          auVar28 = vcmpps_avx(auVar21,*(undefined1 (*) [16])((uVar19 & 0xfffffffffffffff0) + 0xf0),
                               1);
          auVar24 = vandps_avx(auVar24,auVar28);
          auVar22 = vandps_avx(auVar24,auVar22);
          auVar22 = vpslld_avx(auVar22,0x1f);
        }
        else {
          auVar22 = vpslld_avx(auVar22,0x1f);
        }
        uVar15 = vmovmskps_avx(auVar22);
LAB_00b865dc:
        if (uVar15 != 0) {
          uVar14 = uVar19 & 0xfffffffffffffff0;
          lVar16 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar19 = *(ulong *)(uVar14 + lVar16 * 8);
          uVar15 = uVar15 - 1 & uVar15;
          if (uVar15 != 0) {
            uVar3 = *(uint *)(local_1038 + lVar16 * 4);
            lVar16 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar14 + lVar16 * 8);
            uVar4 = *(uint *)(local_1038 + lVar16 * 4);
            uVar15 = uVar15 - 1 & uVar15;
            if (uVar15 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar18 = uVar5;
                *(uint *)(*pauVar18 + 8) = uVar4;
                pauVar18 = pauVar18 + 1;
              }
              else {
                *(ulong *)*pauVar18 = uVar19;
                *(uint *)(*pauVar18 + 8) = uVar3;
                pauVar18 = pauVar18 + 1;
                uVar19 = uVar5;
              }
            }
            else {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = uVar19;
              auVar22 = vpunpcklqdq_avx(auVar23,ZEXT416(uVar3));
              auVar27._8_8_ = 0;
              auVar27._0_8_ = uVar5;
              auVar24 = vpunpcklqdq_avx(auVar27,ZEXT416(uVar4));
              lVar16 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                }
              }
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(uVar14 + lVar16 * 8);
              auVar10 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_1038 + lVar16 * 4)));
              auVar28 = vpcmpgtd_avx(auVar24,auVar22);
              uVar15 = uVar15 - 1 & uVar15;
              if (uVar15 == 0) {
                auVar21 = vpshufd_avx(auVar28,0xaa);
                auVar28 = vblendvps_avx(auVar24,auVar22,auVar21);
                auVar22 = vblendvps_avx(auVar22,auVar24,auVar21);
                auVar24 = vpcmpgtd_avx(auVar10,auVar28);
                auVar21 = vpshufd_avx(auVar24,0xaa);
                auVar24 = vblendvps_avx(auVar10,auVar28,auVar21);
                auVar28 = vblendvps_avx(auVar28,auVar10,auVar21);
                auVar10 = vpcmpgtd_avx(auVar28,auVar22);
                auVar21 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar28,auVar22,auVar21);
                auVar22 = vblendvps_avx(auVar22,auVar28,auVar21);
                *pauVar18 = auVar22;
                pauVar18[1] = auVar10;
                uVar19 = auVar24._0_8_;
                pauVar18 = pauVar18 + 2;
              }
              else {
                lVar16 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                  }
                }
                auVar36._8_8_ = 0;
                auVar36._0_8_ = *(ulong *)(uVar14 + lVar16 * 8);
                auVar25 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)(local_1038 + lVar16 * 4)));
                auVar21 = vpshufd_avx(auVar28,0xaa);
                auVar28 = vblendvps_avx(auVar24,auVar22,auVar21);
                auVar22 = vblendvps_avx(auVar22,auVar24,auVar21);
                auVar24 = vpcmpgtd_avx(auVar25,auVar10);
                auVar21 = vpshufd_avx(auVar24,0xaa);
                auVar24 = vblendvps_avx(auVar25,auVar10,auVar21);
                auVar10 = vblendvps_avx(auVar10,auVar25,auVar21);
                auVar21 = vpcmpgtd_avx(auVar10,auVar22);
                auVar25 = vpshufd_avx(auVar21,0xaa);
                auVar21 = vblendvps_avx(auVar10,auVar22,auVar25);
                auVar22 = vblendvps_avx(auVar22,auVar10,auVar25);
                auVar10 = vpcmpgtd_avx(auVar24,auVar28);
                auVar25 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar24,auVar28,auVar25);
                auVar24 = vblendvps_avx(auVar28,auVar24,auVar25);
                auVar28 = vpcmpgtd_avx(auVar21,auVar24);
                auVar25 = vpshufd_avx(auVar28,0xaa);
                auVar28 = vblendvps_avx(auVar21,auVar24,auVar25);
                auVar24 = vblendvps_avx(auVar24,auVar21,auVar25);
                *pauVar18 = auVar22;
                pauVar18[1] = auVar24;
                pauVar18[2] = auVar28;
                uVar19 = auVar10._0_8_;
                pauVar18 = pauVar18 + 3;
              }
            }
          }
          goto LAB_00b8650a;
        }
        goto LAB_00b864ec;
      }
      if ((uVar19 & 8) == 0) {
        uVar14 = uVar19 & 0xfffffffffffffff0;
        fVar6 = query->time;
        auVar21._4_4_ = fVar6;
        auVar21._0_4_ = fVar6;
        auVar21._8_4_ = fVar6;
        auVar21._12_4_ = fVar6;
        auVar25._0_4_ = fVar6 * *(float *)(uVar14 + 0x80) + *(float *)(uVar14 + 0x20);
        auVar25._4_4_ = fVar6 * *(float *)(uVar14 + 0x84) + *(float *)(uVar14 + 0x24);
        auVar25._8_4_ = fVar6 * *(float *)(uVar14 + 0x88) + *(float *)(uVar14 + 0x28);
        auVar25._12_4_ = fVar6 * *(float *)(uVar14 + 0x8c) + *(float *)(uVar14 + 0x2c);
        auVar29._0_4_ = fVar6 * *(float *)(uVar14 + 0xa0) + *(float *)(uVar14 + 0x40);
        auVar29._4_4_ = fVar6 * *(float *)(uVar14 + 0xa4) + *(float *)(uVar14 + 0x44);
        auVar29._8_4_ = fVar6 * *(float *)(uVar14 + 0xa8) + *(float *)(uVar14 + 0x48);
        auVar29._12_4_ = fVar6 * *(float *)(uVar14 + 0xac) + *(float *)(uVar14 + 0x4c);
        auVar32._0_4_ = fVar6 * *(float *)(uVar14 + 0xc0) + *(float *)(uVar14 + 0x60);
        auVar32._4_4_ = fVar6 * *(float *)(uVar14 + 0xc4) + *(float *)(uVar14 + 100);
        auVar32._8_4_ = fVar6 * *(float *)(uVar14 + 200) + *(float *)(uVar14 + 0x68);
        auVar32._12_4_ = fVar6 * *(float *)(uVar14 + 0xcc) + *(float *)(uVar14 + 0x6c);
        auVar34._0_4_ = fVar6 * *(float *)(uVar14 + 0x90) + *(float *)(uVar14 + 0x30);
        auVar34._4_4_ = fVar6 * *(float *)(uVar14 + 0x94) + *(float *)(uVar14 + 0x34);
        auVar34._8_4_ = fVar6 * *(float *)(uVar14 + 0x98) + *(float *)(uVar14 + 0x38);
        auVar34._12_4_ = fVar6 * *(float *)(uVar14 + 0x9c) + *(float *)(uVar14 + 0x3c);
        auVar37._0_4_ = fVar6 * *(float *)(uVar14 + 0xb0) + *(float *)(uVar14 + 0x50);
        auVar37._4_4_ = fVar6 * *(float *)(uVar14 + 0xb4) + *(float *)(uVar14 + 0x54);
        auVar37._8_4_ = fVar6 * *(float *)(uVar14 + 0xb8) + *(float *)(uVar14 + 0x58);
        auVar37._12_4_ = fVar6 * *(float *)(uVar14 + 0xbc) + *(float *)(uVar14 + 0x5c);
        auVar39._0_4_ = fVar6 * *(float *)(uVar14 + 0xd0) + *(float *)(uVar14 + 0x70);
        auVar39._4_4_ = fVar6 * *(float *)(uVar14 + 0xd4) + *(float *)(uVar14 + 0x74);
        auVar39._8_4_ = fVar6 * *(float *)(uVar14 + 0xd8) + *(float *)(uVar14 + 0x78);
        auVar39._12_4_ = fVar6 * *(float *)(uVar14 + 0xdc) + *(float *)(uVar14 + 0x7c);
        auVar10 = vmaxps_avx(auVar22,auVar25);
        auVar10 = vminps_avx(auVar10,auVar34);
        auVar10 = vsubps_avx(auVar10,auVar22);
        auVar22 = vmaxps_avx(auVar24,auVar29);
        auVar22 = vminps_avx(auVar22,auVar37);
        auVar24 = vsubps_avx(auVar22,auVar24);
        auVar22 = vmaxps_avx(auVar28,auVar32);
        auVar22 = vminps_avx(auVar22,auVar39);
        auVar22 = vsubps_avx(auVar22,auVar28);
        local_1038._0_4_ =
             auVar10._0_4_ * auVar10._0_4_ + auVar24._0_4_ * auVar24._0_4_ +
             auVar22._0_4_ * auVar22._0_4_;
        local_1038._4_4_ =
             auVar10._4_4_ * auVar10._4_4_ + auVar24._4_4_ * auVar24._4_4_ +
             auVar22._4_4_ * auVar22._4_4_;
        fStack_1030 = auVar10._8_4_ * auVar10._8_4_ + auVar24._8_4_ * auVar24._8_4_ +
                      auVar22._8_4_ * auVar22._8_4_;
        fStack_102c = auVar10._12_4_ * auVar10._12_4_ + auVar24._12_4_ * auVar24._12_4_ +
                      auVar22._12_4_ * auVar22._12_4_;
        auVar22 = vcmpps_avx(_local_1038,auVar45._0_16_,2);
        auVar24 = vcmpps_avx(auVar25,auVar34,2);
        auVar22 = vandps_avx(auVar22,auVar24);
        if ((uVar15 & 7) == 6) goto LAB_00b86720;
        uVar15 = vmovmskps_avx(auVar22);
        goto LAB_00b865dc;
      }
LAB_00b868f7:
      lVar16 = (ulong)(uVar15 & 0xf) - 8;
      prim = (InstancePrimitive *)(uVar19 & 0xfffffffffffffff0);
      bVar17 = 0;
      while (bVar20 = lVar16 != 0, lVar16 = lVar16 + -1, bVar20) {
        bVar20 = InstanceIntersector1MB::pointQuery(query,context,prim);
        auVar45 = ZEXT1664(local_f88);
        auVar44 = ZEXT1664(local_fb8);
        auVar42 = ZEXT1664(local_fa8);
        auVar41 = ZEXT1664(local_f98);
        bVar17 = bVar17 | bVar20;
        prim = prim + 1;
      }
      auVar43 = ZEXT1664(local_fc8);
    } while (bVar17 == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar22._4_4_ = uVar1;
    auVar22._0_4_ = uVar1;
    auVar22._8_4_ = uVar1;
    auVar22._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar24._4_4_ = uVar1;
    auVar24._0_4_ = uVar1;
    auVar24._8_4_ = uVar1;
    auVar24._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar28._4_4_ = uVar1;
    auVar28._0_4_ = uVar1;
    auVar28._8_4_ = uVar1;
    auVar28._12_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar43 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      auVar10 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar43 = ZEXT1664(auVar10);
    }
    bVar13 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }